

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaK_exp2RK(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int iVar2;
  int local_2c;
  int local_28;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_exp2val(fs,e);
  eVar1 = e->k;
  if (2 < eVar1 - VNIL) {
    if (eVar1 == VK) {
      if ((e->u).s.info < 0x100) {
        return (e->u).s.info | 0x100;
      }
      goto LAB_001156d9;
    }
    if (eVar1 != VKNUM) goto LAB_001156d9;
  }
  if (fs->nk < 0x100) {
    if (e->k == VNIL) {
      local_28 = nilK(fs);
    }
    else {
      if (e->k == VKNUM) {
        local_2c = luaK_numberK(fs,(e->u).nval);
      }
      else {
        local_2c = boolK(fs,(uint)(e->k == VTRUE));
      }
      local_28 = local_2c;
    }
    (e->u).s.info = local_28;
    e->k = VK;
    return (e->u).s.info | 0x100;
  }
LAB_001156d9:
  iVar2 = luaK_exp2anyreg(fs,e);
  return iVar2;
}

Assistant:

static int luaK_exp2RK(FuncState*fs,expdesc*e){
luaK_exp2val(fs,e);
switch(e->k){
case VKNUM:
case VTRUE:
case VFALSE:
case VNIL:{
if(fs->nk<=((1<<(9-1))-1)){
e->u.s.info=(e->k==VNIL)?nilK(fs):
(e->k==VKNUM)?luaK_numberK(fs,e->u.nval):
boolK(fs,(e->k==VTRUE));
e->k=VK;
return RKASK(e->u.s.info);
}
else break;
}
case VK:{
if(e->u.s.info<=((1<<(9-1))-1))
return RKASK(e->u.s.info);
else break;
}
default:break;
}
return luaK_exp2anyreg(fs,e);
}